

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O1

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (0 < nfr) {
    if (varnorm != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x79,"Variance normalization not implemented in live mode decode\n");
      exit(1);
    }
    uVar7 = 0;
    do {
      pfVar3 = (float *)incep[uVar7];
      if (0.0 < *pfVar3 || *pfVar3 == 0.0) {
        iVar1 = cmn->veclen;
        if (0 < (long)iVar1) {
          pmVar4 = cmn->cmn_mean;
          pmVar5 = cmn->sum;
          lVar9 = 0;
          do {
            pmVar5[lVar9] = (mfcc_t)(pfVar3[lVar9] + (float)pmVar5[lVar9]);
            pfVar3[lVar9] = pfVar3[lVar9] - (float)pmVar4[lVar9];
            lVar9 = lVar9 + 1;
          } while (iVar1 != lVar9);
        }
        cmn->nframe = cmn->nframe + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nfr);
    if (800 < cmn->nframe) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x47,"Update from < %s >\n",cmn->repr);
      iVar1 = cmn->nframe;
      iVar2 = cmn->veclen;
      lVar9 = (long)iVar2;
      if (0 < lVar9) {
        pmVar4 = cmn->cmn_mean;
        pmVar5 = cmn->sum;
        lVar8 = 0;
        do {
          pmVar4[lVar8] = (mfcc_t)((float)pmVar5[lVar8] / (float)iVar1);
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      if (799 < iVar1) {
        if (0 < iVar2) {
          pmVar4 = cmn->sum;
          lVar8 = 0;
          do {
            pmVar4[lVar8] = (mfcc_t)((float)pmVar4[lVar8] * (1.0 / (float)iVar1) * 500.0);
            lVar8 = lVar8 + 1;
          } while (lVar9 != lVar8);
        }
        cmn->nframe = 500;
      }
      pcVar6 = cmn_update_repr(cmn);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
              ,0x53,"Update to   < %s >\n",pcVar6);
      return;
    }
  }
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}